

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::WriteXMLLabels(cmCTestLaunch *this,cmXMLElement *e2)

{
  bool bVar1;
  allocator<char> local_61;
  string local_60;
  reference local_40;
  string *label;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmXMLElement e3;
  cmXMLElement *e2_local;
  cmCTestLaunch *this_local;
  
  e3.xmlwr = (cmXMLWriter *)e2;
  LoadLabels(this);
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Labels);
  if (!bVar1) {
    cmXMLElement::Comment((cmXMLElement *)e3.xmlwr,"Interested parties");
    cmXMLElement::cmXMLElement((cmXMLElement *)&__range2,(cmXMLElement *)e3.xmlwr,"Labels");
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->Labels);
    label = (string *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->Labels);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&label);
      if (!bVar1) break;
      local_40 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Label",&local_61);
      cmXMLElement::Element<std::__cxx11::string>((cmXMLElement *)&__range2,&local_60,local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    cmXMLElement::~cmXMLElement((cmXMLElement *)&__range2);
  }
  return;
}

Assistant:

void cmCTestLaunch::WriteXMLLabels(cmXMLElement& e2)
{
  this->LoadLabels();
  if (!this->Labels.empty()) {
    e2.Comment("Interested parties");
    cmXMLElement e3(e2, "Labels");
    for (std::string const& label : this->Labels) {
      e3.Element("Label", label);
    }
  }
}